

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

TValue * index2adr(lua_State *L,int idx)

{
  long lVar1;
  uint64_t uVar2;
  ulong uVar3;
  
  if (idx < 1) {
    if (-10000 < idx) {
      return L->top + idx;
    }
    if (idx == -10000) {
      lVar1 = 0x110;
      goto LAB_00112088;
    }
    if (idx == -0x2712) {
      uVar2 = (L->glref).ptr64;
      *(uint64_t *)(uVar2 + 0xe8) = (L->env).gcptr64 | 0xfffa000000000000;
LAB_00112106:
      return (TValue *)(uVar2 + 0xe8);
    }
    uVar3 = L->base[-2].u64 & 0x7fffffffffff;
    if (idx == -0x2711) {
      uVar2 = (L->glref).ptr64;
      *(ulong *)(uVar2 + 0xe8) = *(ulong *)(uVar3 + 0x10) | 0xfffa000000000000;
      goto LAB_00112106;
    }
    if (-0x2712 - idx <= (int)(uint)*(byte *)(uVar3 + 0xb)) {
      return (TValue *)(uVar3 + (long)(-0x2713 - idx) * 8 + 0x30);
    }
  }
  else if (L->base + ((ulong)(uint)idx - 1) < L->top) {
    return L->base + ((ulong)(uint)idx - 1);
  }
  lVar1 = 0xf8;
LAB_00112088:
  return (TValue *)(lVar1 + (L->glref).ptr64);
}

Assistant:

static TValue *index2adr(lua_State *L, int idx)
{
  if (idx > 0) {
    TValue *o = L->base + (idx - 1);
    return o < L->top ? o : niltv(L);
  } else if (idx > LUA_REGISTRYINDEX) {
    lj_checkapi(idx != 0 && -idx <= L->top - L->base,
		"bad stack slot %d", idx);
    return L->top + idx;
  } else if (idx == LUA_GLOBALSINDEX) {
    TValue *o = &G(L)->tmptv;
    settabV(L, o, tabref(L->env));
    return o;
  } else if (idx == LUA_REGISTRYINDEX) {
    return registry(L);
  } else {
    GCfunc *fn = curr_func(L);
    lj_checkapi(fn->c.gct == ~LJ_TFUNC && !isluafunc(fn),
		"calling frame is not a C function");
    if (idx == LUA_ENVIRONINDEX) {
      TValue *o = &G(L)->tmptv;
      settabV(L, o, tabref(fn->c.env));
      return o;
    } else {
      idx = LUA_GLOBALSINDEX - idx;
      return idx <= fn->c.nupvalues ? &fn->c.upvalue[idx-1] : niltv(L);
    }
  }
}